

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

ArrayPtr<const_unsigned_char> __thiscall capnp::_::ListReader::asRawBytes(ListReader *this)

{
  ulong uVar1;
  byte *pbVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  Fault f;
  Fault local_18;
  
  if (this->structPointerCount == 0) {
    pbVar2 = this->ptr;
    uVar1 = (ulong)this->structDataSize * (ulong)this->elementCount + 7 >> 3;
  }
  else {
    pbVar2 = (byte *)0x0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc20,FAILED,"structPointerCount == ZERO * POINTERS",
               "\"Expected data only, got pointers.\"",
               (char (*) [34])"Expected data only, got pointers.");
    kj::_::Debug::Fault::~Fault(&local_18);
    uVar1 = 0;
  }
  AVar3.size_ = uVar1;
  AVar3.ptr = pbVar2;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const byte> ListReader::asRawBytes() const {
  KJ_REQUIRE(structPointerCount == ZERO * POINTERS,
             "Expected data only, got pointers.") {
    return kj::ArrayPtr<const byte>();
  }

  return arrayPtr(reinterpret_cast<const byte*>(ptr),
      WireHelpers::roundBitsUpToBytes(
          upgradeBound<uint64_t>(elementCount) * (structDataSize / ELEMENTS)));
}